

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O2

void __thiscall
spdlog::details::registry::set_default_logger
          (registry *this,shared_ptr<spdlog::logger> *new_default_logger)

{
  element_type *peVar1;
  __shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> *this_00;
  
  std::mutex::lock(&this->logger_map_mutex_);
  peVar1 = (this->default_logger_).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 != (element_type *)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase(&(this->loggers_)._M_h,&peVar1->name_);
  }
  peVar1 = (new_default_logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (peVar1 != (element_type *)0x0) {
    this_00 = &std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->loggers_,&peVar1->name_)->
               super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_00,&new_default_logger->
                        super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>);
  }
  std::__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->default_logger_).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>
             ,&new_default_logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

SPDLOG_INLINE void registry::set_default_logger(std::shared_ptr<logger> new_default_logger)
{
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    // remove previous default logger from the map
    if (default_logger_ != nullptr)
    {
        loggers_.erase(default_logger_->name());
    }
    if (new_default_logger != nullptr)
    {
        loggers_[new_default_logger->name()] = new_default_logger;
    }
    default_logger_ = std::move(new_default_logger);
}